

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

int CBinds::GetModifierMask(IInput *i)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  long *in_RDI;
  int Mask;
  uint local_4;
  
  bVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,0x161);
  bVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,0x165);
  bVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,0x160);
  bVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,0x164);
  bVar5 = (**(code **)(*in_RDI + 0x20))(in_RDI,0x162);
  local_4 = (uint)(bVar5 & 1) << 3 |
            (uint)(bVar4 & 1) << 2 | (uint)(bVar3 & 1) << 2 | (uint)(bVar2 & 1 | bVar1 & 1) << 1;
  if (local_4 == 0) {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CBinds::GetModifierMask(IInput *i)
{
	int Mask = 0;
	// since we only handle one modifier, when doing ctrl+q and shift+q, execute both
	Mask |= i->KeyIsPressed(KEY_LSHIFT) << CBinds::MODIFIER_SHIFT;
	Mask |= i->KeyIsPressed(KEY_RSHIFT) << CBinds::MODIFIER_SHIFT;
	Mask |= i->KeyIsPressed(KEY_LCTRL) << CBinds::MODIFIER_CTRL;
	Mask |= i->KeyIsPressed(KEY_RCTRL) << CBinds::MODIFIER_CTRL;
	Mask |= i->KeyIsPressed(KEY_LALT) << CBinds::MODIFIER_ALT;
	if(Mask == 0)
		return 1; // if no modifier, flag with MODIFIER_NONE
	return Mask;
}